

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O0

Option * __thiscall MetaCommand::GetOptionByMinusTag(MetaCommand *this,string *minusTag)

{
  bool bVar1;
  __type _Var2;
  reference pOVar3;
  __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
  *in_RSI;
  string tagToSearch;
  iterator it;
  allocator *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  string local_48 [32];
  Option *local_28;
  __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
  local_20 [3];
  reference local_8;
  
  local_20[0]._M_current =
       (Option *)
       std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::begin
                 ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                  in_stack_ffffffffffffff88);
  do {
    local_28 = (Option *)
               std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::end
                         ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                          in_stack_ffffffffffffff88);
    bVar1 = __gnu_cxx::operator!=
                      (in_RSI,(__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                               *)in_stack_ffffffffffffff88);
    if (!bVar1) {
      return (Option *)0x0;
    }
    in_stack_ffffffffffffff88 = (allocator *)&stack0xffffffffffffffb7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"-",in_stack_ffffffffffffff88);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
    pOVar3 = __gnu_cxx::
             __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
             ::operator*(local_20);
    std::__cxx11::string::operator+=(local_48,(string *)&pOVar3->tag);
    _Var2 = std::operator==(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (_Var2) {
      local_8 = __gnu_cxx::
                __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                ::operator*(local_20);
    }
    else {
      __gnu_cxx::
      __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
      ::operator++(local_20);
    }
    std::__cxx11::string::~string(local_48);
  } while (!_Var2);
  return local_8;
}

Assistant:

MetaCommand::Option *
MetaCommand::GetOptionByMinusTag(METAIO_STL::string minusTag)
{
  auto it = m_OptionVector.begin();
  while(it != m_OptionVector.end())
    {
    METAIO_STL::string tagToSearch = "-";
    tagToSearch += (*it).tag;
    if(tagToSearch == minusTag)
      {
      return &(*it);
      }
    ++it;
    }
    return nullptr;
}